

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::FunctionExp(SQCompiler *this,SQInteger ftype,bool lambda)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQObjectPtr dummy;
  SQObject local_38;
  SQInstruction local_28;
  
  SVar1 = SQLexer::Lex(&this->_lex);
  this->_token = SVar1;
  Expect(this,0x28);
  local_38._type = OT_NULL;
  local_38._unVal.pTable = (SQTable *)0x0;
  CreateFunction(this,&local_38,lambda);
  this_00 = this->_fs;
  SVar1 = SQFuncState::PushTarget(this_00,-1);
  local_28._arg1 = (int)(this->_fs->_functions)._size + -1;
  local_28._arg2 = ftype != 0x11d;
  local_28.op = '0';
  local_28._arg0 = (uchar)SVar1;
  local_28._arg3 = '\0';
  SQFuncState::AddInstruction(this_00,&local_28);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
  return;
}

Assistant:

void FunctionExp(SQInteger ftype,bool lambda = false)
    {
        Lex(); Expect(_SC('('));
        SQObjectPtr dummy;
        CreateFunction(dummy,lambda);
        _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, ftype == TK_FUNCTION?0:1);
    }